

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageColorTint(Image *image,Color color)

{
  uint uVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  ulong uVar15;
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [14];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint6 uVar22;
  undefined1 auVar23 [16];
  int iVar24;
  Color *pCVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  short sVar34;
  int iVar35;
  Color CVar37;
  int iVar40;
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar36;
  undefined6 uVar38;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar25 = LoadImageColors(*image);
    auVar23 = _DAT_0015ba60;
    Var16 = CONCAT81(SUB158(ZEXT815(0),7),color.a);
    auVar20._9_6_ = 0;
    auVar20._0_9_ = Var16;
    auVar17._1_10_ = SUB1510(auVar20 << 0x30,5);
    auVar17[0] = color.b;
    auVar21._11_4_ = 0;
    auVar21._0_11_ = auVar17;
    auVar13[2] = color.g;
    auVar13._0_2_ = color._0_2_;
    auVar13._3_12_ = SUB1512(auVar21 << 0x20,3);
    auVar14._2_13_ = auVar13._2_13_;
    auVar14._0_2_ = color._0_2_ & 0xff;
    auVar8._10_2_ = 0;
    auVar8._0_10_ = auVar14._0_10_;
    auVar8._12_2_ = (short)Var16;
    uVar22 = CONCAT42(auVar8._10_4_,auVar17._0_2_);
    auVar18._6_8_ = 0;
    auVar18._0_6_ = uVar22;
    auVar9._4_2_ = auVar13._2_2_;
    auVar9._0_4_ = auVar14._0_4_;
    auVar9._6_8_ = SUB148(auVar18 << 0x40,6);
    auVar29._0_4_ = (float)(auVar14._0_4_ & 0xffff);
    auVar29._4_4_ = (float)auVar9._4_4_;
    auVar29._8_4_ = (float)(int)uVar22;
    auVar29._12_4_ = (float)(auVar8._10_4_ >> 0x10);
    auVar29 = divps(auVar29,_DAT_0015ba60);
    iVar26 = 0;
    iVar24 = image->height;
    if (image->height < 1) {
      iVar24 = 0;
    }
    fVar30 = (float)DAT_0015ba60;
    fVar31 = DAT_0015ba60._4_4_;
    fVar32 = DAT_0015ba60._8_4_;
    fVar33 = DAT_0015ba60._12_4_;
    for (; iVar26 != iVar24; iVar26 = iVar26 + 1) {
      uVar1 = image->width;
      uVar27 = 0;
      if (0 < (int)uVar1) {
        uVar27 = (ulong)uVar1;
      }
      for (uVar28 = 0; uVar27 != uVar28; uVar28 = uVar28 + 1) {
        CVar37 = pCVar25[(long)(int)(uVar1 * iVar26) + uVar28];
        uVar15 = (ulong)CVar37._0_2_ & 0xffffffffffff00ff;
        auVar10._8_4_ = 0;
        auVar10._0_8_ = uVar15;
        auVar10[0xc] = CVar37.a;
        auVar11[8] = CVar37.b;
        auVar11._0_8_ = uVar15;
        auVar11[9] = 0;
        auVar11._10_3_ = auVar10._10_3_;
        auVar19._5_8_ = 0;
        auVar19._0_5_ = auVar11._8_5_;
        auVar12[4] = CVar37.g;
        auVar12._0_4_ = (int)uVar15;
        auVar12[5] = 0;
        auVar12._6_7_ = SUB137(auVar19 << 0x40,6);
        auVar39._0_4_ = (float)(int)uVar15;
        auVar39._4_4_ = (float)auVar12._4_4_;
        auVar39._8_4_ = (float)auVar11._8_4_;
        auVar39._12_4_ = (float)(uint3)(auVar10._10_3_ >> 0x10);
        auVar39 = divps(auVar39,auVar23);
        iVar35 = (int)(auVar39._0_4_ * auVar29._0_4_ * fVar30);
        iVar40 = (int)(auVar39._4_4_ * auVar29._4_4_ * fVar31);
        iVar41 = (int)(auVar39._8_4_ * auVar29._8_4_ * fVar32);
        iVar42 = (int)(auVar39._12_4_ * auVar29._12_4_ * fVar33);
        sVar6 = (short)iVar35;
        cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar35 - (0xff < sVar6);
        sVar6 = (short)((uint)iVar35 >> 0x10);
        sVar34 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar35 >> 0x10) -
                          (0xff < sVar6),cVar2);
        sVar6 = (short)iVar40;
        cVar3 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar40 - (0xff < sVar6);
        sVar6 = (short)((uint)iVar40 >> 0x10);
        uVar36 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar40 >> 0x10) -
                          (0xff < sVar6),CONCAT12(cVar3,sVar34));
        sVar6 = (short)iVar41;
        cVar4 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar41 - (0xff < sVar6);
        sVar6 = (short)((uint)iVar41 >> 0x10);
        uVar38 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar41 >> 0x10) -
                          (0xff < sVar6),CONCAT14(cVar4,uVar36));
        sVar6 = (short)iVar42;
        cVar5 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar42 - (0xff < sVar6);
        sVar7 = (short)((uint)iVar42 >> 0x10);
        sVar6 = (short)((uint)uVar36 >> 0x10);
        CVar37.g = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
        CVar37.r = (0 < sVar34) * (sVar34 < 0x100) * cVar2 - (0xff < sVar34);
        sVar6 = (short)((uint6)uVar38 >> 0x20);
        CVar37.b = (0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6);
        sVar6 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar42 >> 0x10) -
                                 (0xff < sVar7),CONCAT16(cVar5,uVar38)) >> 0x30);
        CVar37.a = (0 < sVar6) * (sVar6 < 0x100) * cVar5 - (0xff < sVar6);
        pCVar25[(long)(int)(uVar1 * iVar26) + uVar28] = CVar37;
      }
    }
    iVar24 = image->format;
    free(image->data);
    image->data = pCVar25;
    image->format = 7;
    ImageFormat(image,iVar24);
    return;
  }
  return;
}

Assistant:

void ImageColorTint(Image *image, Color color)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    float cR = (float)color.r/255;
    float cG = (float)color.g/255;
    float cB = (float)color.b/255;
    float cA = (float)color.a/255;

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int index = y*image->width + x;
            unsigned char r = (unsigned char)(((float)pixels[index].r/255*cR)*255.0f);
            unsigned char g = (unsigned char)(((float)pixels[index].g/255*cG)*255.0f);
            unsigned char b = (unsigned char)(((float)pixels[index].b/255*cB)*255.0f);
            unsigned char a = (unsigned char)(((float)pixels[index].a/255*cA)*255.0f);

            pixels[y*image->width + x].r = r;
            pixels[y*image->width + x].g = g;
            pixels[y*image->width + x].b = b;
            pixels[y*image->width + x].a = a;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}